

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted-usec-list.c
# Opt level: O0

int lws_sul_earliest_wakeable_event(lws_context *ctx,lws_usec_t *pearliest)

{
  lws_dll2 *plVar1;
  lws_sorted_usec_list_t *sul;
  lws_usec_t lowest;
  int hit;
  int n;
  lws_context_per_thread *pt;
  lws_usec_t *pearliest_local;
  lws_context *ctx_local;
  
  lowest._0_4_ = -1;
  sul = (lws_sorted_usec_list_t *)0x0;
  for (lowest._4_4_ = 0; lowest._4_4_ < (int)(uint)ctx->count_threads;
      lowest._4_4_ = lowest._4_4_ + 1) {
    if ((ctx->pt[lowest._4_4_].pt_sul_owner[1].count != 0) &&
       ((plVar1 = lws_dll2_get_head(ctx->pt[lowest._4_4_].pt_sul_owner + 1), (int)lowest == -1 ||
        ((long)plVar1[1].prev < (long)sul)))) {
      lowest._0_4_ = lowest._4_4_;
      sul = (lws_sorted_usec_list_t *)plVar1[1].prev;
    }
  }
  if ((int)lowest != -1) {
    *pearliest = (lws_usec_t)sul;
  }
  ctx_local._4_4_ = (uint)((int)lowest == -1);
  return ctx_local._4_4_;
}

Assistant:

int
lws_sul_earliest_wakeable_event(struct lws_context *ctx, lws_usec_t *pearliest)
{
	struct lws_context_per_thread *pt;
	int n = 0, hit = -1;
	lws_usec_t lowest = 0;

	for (n = 0; n < ctx->count_threads; n++) {
		pt = &ctx->pt[n];

		lws_pt_lock(pt, __func__);

		if (pt->pt_sul_owner[LWSSULLI_WAKE_IF_SUSPENDED].count) {
			lws_sorted_usec_list_t *sul = (lws_sorted_usec_list_t *)
					lws_dll2_get_head(&pt->pt_sul_owner[
					           LWSSULLI_WAKE_IF_SUSPENDED]);

			if (hit == -1 || sul->us < lowest) {
				hit = n;
				lowest = sul->us;
			}
		}

		lws_pt_unlock(pt);
	}


	if (hit == -1)
		/* there is no pending event */
		return 1;

	*pearliest = lowest;

	return 0;
}